

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_print.c
# Opt level: O0

void h264_print_pred_weight_table(h264_slice *slice,h264_pred_weight_table *table)

{
  uint local_1c;
  int i;
  h264_pred_weight_table *table_local;
  h264_slice *slice_local;
  
  printf("\tluma_log2_weight_denom = %d\n",(ulong)table->luma_log2_weight_denom);
  printf("\tchroma_log2_weight_denom = %d\n",(ulong)table->chroma_log2_weight_denom);
  for (local_1c = 0; local_1c <= slice->num_ref_idx_l0_active_minus1; local_1c = local_1c + 1) {
    printf("\tluma_weight_l0_flag[%d] = %d\n",(ulong)local_1c,
           (ulong)table->l0[(int)local_1c].luma_weight_flag);
    printf("\tluma_weight_l0[%d] = %d\n",(ulong)local_1c,
           (ulong)(uint)table->l0[(int)local_1c].luma_weight);
    printf("\tluma_offset_l0[%d] = %d\n",(ulong)local_1c,
           (ulong)(uint)table->l0[(int)local_1c].luma_offset);
    printf("\tchroma_weight_l0_flag[%d] = %d\n",(ulong)local_1c,
           (ulong)table->l0[(int)local_1c].chroma_weight_flag);
    printf("\tchroma_weight_l0[%d][0] = %d\n",(ulong)local_1c,
           (ulong)(uint)table->l0[(int)local_1c].chroma_weight[0]);
    printf("\tchroma_weight_l0[%d][1] = %d\n",(ulong)local_1c,
           (ulong)(uint)table->l0[(int)local_1c].chroma_weight[1]);
    printf("\tchroma_offset_l0[%d][0] = %d\n",(ulong)local_1c,
           (ulong)(uint)table->l0[(int)local_1c].chroma_offset[0]);
    printf("\tchroma_offset_l0[%d][1] = %d\n",(ulong)local_1c,
           (ulong)(uint)table->l0[(int)local_1c].chroma_offset[1]);
  }
  if (slice->slice_type == 1) {
    for (local_1c = 0; local_1c <= slice->num_ref_idx_l1_active_minus1; local_1c = local_1c + 1) {
      printf("\tluma_weight_l1_flag[%d] = %d\n",(ulong)local_1c,
             (ulong)table->l1[(int)local_1c].luma_weight_flag);
      printf("\tluma_weight_l1[%d] = %d\n",(ulong)local_1c,
             (ulong)(uint)table->l1[(int)local_1c].luma_weight);
      printf("\tluma_offset_l1[%d] = %d\n",(ulong)local_1c,
             (ulong)(uint)table->l1[(int)local_1c].luma_offset);
      printf("\tchroma_weight_l1_flag[%d] = %d\n",(ulong)local_1c,
             (ulong)table->l1[(int)local_1c].chroma_weight_flag);
      printf("\tchroma_weight_l1[%d][0] = %d\n",(ulong)local_1c,
             (ulong)(uint)table->l1[(int)local_1c].chroma_weight[0]);
      printf("\tchroma_weight_l1[%d][1] = %d\n",(ulong)local_1c,
             (ulong)(uint)table->l1[(int)local_1c].chroma_weight[1]);
      printf("\tchroma_offset_l1[%d][0] = %d\n",(ulong)local_1c,
             (ulong)(uint)table->l1[(int)local_1c].chroma_offset[0]);
      printf("\tchroma_offset_l1[%d][1] = %d\n",(ulong)local_1c,
             (ulong)(uint)table->l1[(int)local_1c].chroma_offset[1]);
    }
  }
  return;
}

Assistant:

void h264_print_pred_weight_table(struct h264_slice *slice, struct h264_pred_weight_table *table) {
	printf("\tluma_log2_weight_denom = %d\n", table->luma_log2_weight_denom);
	printf("\tchroma_log2_weight_denom = %d\n", table->chroma_log2_weight_denom);
	int i;
	for (i = 0; i <= slice->num_ref_idx_l0_active_minus1; i++) {
		printf("\tluma_weight_l0_flag[%d] = %d\n", i, table->l0[i].luma_weight_flag);
		printf("\tluma_weight_l0[%d] = %d\n", i, table->l0[i].luma_weight);
		printf("\tluma_offset_l0[%d] = %d\n", i, table->l0[i].luma_offset);
		printf("\tchroma_weight_l0_flag[%d] = %d\n", i, table->l0[i].chroma_weight_flag);
		printf("\tchroma_weight_l0[%d][0] = %d\n", i, table->l0[i].chroma_weight[0]);
		printf("\tchroma_weight_l0[%d][1] = %d\n", i, table->l0[i].chroma_weight[1]);
		printf("\tchroma_offset_l0[%d][0] = %d\n", i, table->l0[i].chroma_offset[0]);
		printf("\tchroma_offset_l0[%d][1] = %d\n", i, table->l0[i].chroma_offset[1]);
	}
	if (slice->slice_type == H264_SLICE_TYPE_B) {
		for (i = 0; i <= slice->num_ref_idx_l1_active_minus1; i++) {
			printf("\tluma_weight_l1_flag[%d] = %d\n", i, table->l1[i].luma_weight_flag);
			printf("\tluma_weight_l1[%d] = %d\n", i, table->l1[i].luma_weight);
			printf("\tluma_offset_l1[%d] = %d\n", i, table->l1[i].luma_offset);
			printf("\tchroma_weight_l1_flag[%d] = %d\n", i, table->l1[i].chroma_weight_flag);
			printf("\tchroma_weight_l1[%d][0] = %d\n", i, table->l1[i].chroma_weight[0]);
			printf("\tchroma_weight_l1[%d][1] = %d\n", i, table->l1[i].chroma_weight[1]);
			printf("\tchroma_offset_l1[%d][0] = %d\n", i, table->l1[i].chroma_offset[0]);
			printf("\tchroma_offset_l1[%d][1] = %d\n", i, table->l1[i].chroma_offset[1]);
		}
	}
}